

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_9;
  ostringstream error_message_8;
  int output;
  double input;
  int bias;
  ostringstream error_message_7;
  UniformQuantization uniform_quantization;
  istream *input_stream;
  ostringstream error_message_6;
  ifstream ifs;
  ostringstream error_message_5;
  char *input_file;
  ostringstream error_message_4;
  int num_input_files;
  ostringstream error_message_3;
  int tmp_1;
  int max_1;
  int min_1;
  ostringstream error_message_2;
  int tmp;
  int max;
  int min;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  OutputFormats output_format;
  QuantizationType quantization_type;
  int num_bit;
  double absolute_maximum_value;
  option *in_stack_ffffffffffffeb08;
  istream *in_stack_ffffffffffffeb10;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffeb18;
  undefined1 in_stack_ffffffffffffeb1f;
  UniformQuantization *in_stack_ffffffffffffeb20;
  undefined2 in_stack_ffffffffffffeb28;
  undefined1 in_stack_ffffffffffffeb2a;
  ostream *in_stack_ffffffffffffeb30;
  char *local_14c0;
  char *local_1478;
  byte local_142a;
  byte local_13e2;
  bool local_13ba;
  bool local_1392;
  allocator local_1371;
  string local_1370 [32];
  ostringstream local_1350 [72];
  ostringstream *in_stack_ffffffffffffecf8;
  string *in_stack_ffffffffffffed00;
  allocator local_11d1;
  string local_11d0 [32];
  ostringstream local_11b0 [380];
  int local_1034;
  int local_1028;
  allocator local_1021;
  string local_1020 [32];
  ostringstream local_1000 [376];
  UniformQuantization local_e88;
  char *local_e60;
  undefined4 local_e58;
  allocator local_e51;
  string local_e50 [32];
  ostringstream local_e30 [376];
  char local_cb8 [527];
  allocator local_aa9;
  string local_aa8 [32];
  ostringstream local_a88 [376];
  char *local_910;
  allocator local_901;
  string local_900 [32];
  ostringstream local_8e0 [376];
  int local_768;
  allocator local_761;
  string local_760 [32];
  ostringstream local_740 [383];
  allocator local_5c1;
  string local_5c0 [32];
  int local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [32];
  int local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [32];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 32768.0;
  local_1c = 8;
  local_20 = 0;
  local_24 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_28 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffeb20 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffeb1f,
                                                     in_stack_ffffffffffffeb18),
                                   (char *)in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,
                                   (int *)0x103766), pcVar1 = ya_optarg, local_28 != -1) {
    switch(local_28) {
    case 0x62:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                         (int *)in_stack_ffffffffffffeb10);
      local_13ba = !bVar2 || local_1c < 1;
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if (local_13ba) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        std::operator<<((ostream *)local_3a0,
                        "The argument for the -b option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"quantize",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_915::PrintUsage(in_stack_ffffffffffffeb30);
      return 1;
    case 0x68:
      anon_unknown.dwarf_915::PrintUsage(in_stack_ffffffffffffeb30);
      return 0;
    case 0x6f:
      local_598 = 0;
      local_59c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,pcVar1,&local_5c1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                         (int *)in_stack_ffffffffffffeb10);
      local_142a = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_5a0,0,1);
        local_142a = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      if ((local_142a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_740);
        poVar5 = std::operator<<((ostream *)local_740,
                                 "The argument for the -o option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_760,"quantize",&local_761);
        sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
        std::__cxx11::string::~string(local_760);
        std::allocator<char>::~allocator((allocator<char> *)&local_761);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_740);
        return local_4;
      }
      local_24 = local_5a0;
      break;
    case 0x74:
      local_3c8 = 0;
      local_3cc = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                         (int *)in_stack_ffffffffffffeb10);
      local_13e2 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3d0,0,1);
        local_13e2 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if ((local_13e2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        poVar5 = std::operator<<((ostream *)local_570,
                                 "The argument for the -t option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"quantize",&local_591);
        sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
      local_20 = local_3d0;
      break;
    case 0x76:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar1,&local_49);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                         (double *)in_stack_ffffffffffffeb10);
      local_1392 = !bVar2 || local_18 <= 0.0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_1392) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        std::operator<<((ostream *)local_1d8,
                        "The argument for the -v option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"quantize",&local_1f9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
    }
  }
  local_768 = local_8 - ya_optind;
  if (1 < local_768) {
    std::__cxx11::ostringstream::ostringstream(local_8e0);
    std::operator<<((ostream *)local_8e0,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"quantize",&local_901);
    sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8e0);
    return local_4;
  }
  if (local_768 == 0) {
    local_1478 = (char *)0x0;
  }
  else {
    local_1478 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_910 = local_1478;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_a88);
    std::operator<<((ostream *)local_a88,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_aa8,"quantize",&local_aa9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
    std::__cxx11::string::~string(local_aa8);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a88);
    return local_4;
  }
  std::ifstream::ifstream(local_cb8);
  pcVar1 = local_910;
  if (local_910 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_cb8,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_e30);
      poVar5 = std::operator<<((ostream *)local_e30,"Cannot open file ");
      std::operator<<(poVar5,local_910);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e50,"quantize",&local_e51);
      sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
      std::__cxx11::string::~string(local_e50);
      std::allocator<char>::~allocator((allocator<char> *)&local_e51);
      local_4 = 1;
      local_e58 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_e30);
      goto LAB_00104b5a;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_14c0 = (char *)&std::cin;
  }
  else {
    local_14c0 = local_cb8;
  }
  local_e60 = local_14c0;
  sptk::UniformQuantization::UniformQuantization
            (in_stack_ffffffffffffeb20,
             (double)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
             (int)((ulong)in_stack_ffffffffffffeb10 >> 0x20),
             (QuantizationType)in_stack_ffffffffffffeb10);
  bVar2 = sptk::UniformQuantization::IsValid(&local_e88);
  if (bVar2) {
    iVar4 = sptk::UniformQuantization::GetQuantizationLevels(&local_e88);
    local_1028 = -iVar4 / 2;
    do {
      bVar2 = sptk::ReadStream<double>
                        ((double *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18),
                         in_stack_ffffffffffffeb10);
      if (!bVar2) {
        local_4 = 0;
        local_e58 = 1;
        goto LAB_00104b3c;
      }
      in_stack_ffffffffffffeb2a =
           sptk::UniformQuantization::Run
                     ((UniformQuantization *)
                      CONCAT44(iVar4,CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffeb2a,
                                                             in_stack_ffffffffffffeb28))),
                      (double)in_stack_ffffffffffffeb20,
                      (int *)CONCAT17(in_stack_ffffffffffffeb1f,in_stack_ffffffffffffeb18));
      if (!(bool)in_stack_ffffffffffffeb2a) {
        std::__cxx11::ostringstream::ostringstream(local_11b0);
        std::operator<<((ostream *)local_11b0,"Failed to quantize input");
        paVar6 = &local_11d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11d0,"quantize",paVar6);
        sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
        std::__cxx11::string::~string(local_11d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
        local_4 = 1;
        local_e58 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_11b0);
        goto LAB_00104b3c;
      }
      if (local_24 == 1) {
        local_1034 = local_1028 + local_1034;
      }
      in_stack_ffffffffffffeb1f =
           sptk::WriteStream<int>
                     ((int)in_stack_ffffffffffffeb10,(ostream *)in_stack_ffffffffffffeb08);
    } while ((bool)in_stack_ffffffffffffeb1f);
    std::__cxx11::ostringstream::ostringstream(local_1350);
    std::operator<<((ostream *)local_1350,"Failed to write a quantized sequence");
    paVar6 = &local_1371;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1370,"quantize",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
    std::__cxx11::string::~string(local_1370);
    std::allocator<char>::~allocator((allocator<char> *)&local_1371);
    local_4 = 1;
    local_e58 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1350);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1000);
    std::operator<<((ostream *)local_1000,"Failed to initialize UniformQuantization");
    paVar6 = &local_1021;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1020,"quantize",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8);
    std::__cxx11::string::~string(local_1020);
    std::allocator<char>::~allocator((allocator<char> *)&local_1021);
    local_4 = 1;
    local_e58 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1000);
  }
LAB_00104b3c:
  sptk::UniformQuantization::~UniformQuantization(&local_e88);
LAB_00104b5a:
  std::ifstream::~ifstream(local_cb8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  double absolute_maximum_value(kDefaultAbsoluteMaximumValue);
  int num_bit(kDefaultNumBit);
  sptk::UniformQuantization::QuantizationType quantization_type(
      kDefaultQuantizationType);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "v:b:t:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'v': {
        if (!sptk::ConvertStringToDouble(optarg, &absolute_maximum_value) ||
            absolute_maximum_value <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a positive number";
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bit) || num_bit <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::UniformQuantization::QuantizationType::
                                 kNumQuantizationTypes) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        quantization_type =
            static_cast<sptk::UniformQuantization::QuantizationType>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("quantize", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::UniformQuantization uniform_quantization(absolute_maximum_value,
                                                 num_bit, quantization_type);
  if (!uniform_quantization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize UniformQuantization";
    sptk::PrintErrorMessage("quantize", error_message);
    return 1;
  }

  const int bias(-uniform_quantization.GetQuantizationLevels() / 2);
  double input;
  int output;

  while (sptk::ReadStream(&input, &input_stream)) {
    if (!uniform_quantization.Run(input, &output)) {
      std::ostringstream error_message;
      error_message << "Failed to quantize input";
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }

    if (kInteger == output_format) {
      output += bias;
    }

    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a quantized sequence";
      sptk::PrintErrorMessage("quantize", error_message);
      return 1;
    }
  }

  return 0;
}